

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tile.cxx
# Opt level: O3

void __thiscall Fl_Tile::resize(Fl_Tile *this,int X,int Y,int W,int H)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  long lVar3;
  
  Fl_Group::sizes(&this->super_Fl_Group);
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  iVar1 = (this->super_Fl_Group).children_;
  if (iVar1 != 0) {
    lVar3 = 0;
    do {
      (*ppFVar2[lVar3]->_vptr_Fl_Widget[4])();
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void Fl_Tile::resize(int X,int Y,int W,int H) {

  // remember how much to move the child widgets:
  int dx = X-x();
  int dy = Y-y();
  int dw = W-w();
  int dh = H-h();
  int *p = sizes();
  // resize this (skip the Fl_Group resize):
  Fl_Widget::resize(X,Y,W,H);

  // find bottom-right corner of resizable:
  int OR = p[5];		// old right border
  int NR = X+W-(p[1]-OR);	// new right border
  int OB = p[7];		// old bottom border
  int NB = Y+H-(p[3]-OB);	// new bottom border

  // move everything to be on correct side of new resizable:
  Fl_Widget*const* a = array();
  p += 8;
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    int xx = o->x()+dx;
    int R = xx+o->w();
    if (*p++ >= OR) xx += dw; else if (xx > NR) xx = NR;
    if (*p++ >= OR) R += dw; else if (R > NR) R = NR;
    int yy = o->y()+dy;
    int B = yy+o->h();
    if (*p++ >= OB) yy += dh; else if (yy > NB) yy = NB;
    if (*p++ >= OB) B += dh; else if (B > NB) B = NB;
    o->resize(xx,yy,R-xx,B-yy);
    // do *not* call o->redraw() here! If you do, and the tile is inside a
    // scroll, it'll set the damage areas wrong for all children!
  }
}